

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_sum.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  mbedtls_md_type_t *pmVar5;
  mbedtls_md_info_t *pmVar6;
  char *pcVar7;
  FILE *__stream;
  size_t sVar8;
  char cVar9;
  byte *pbVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  size_t sVar14;
  uint local_538;
  uint local_534;
  mbedtls_md_context_t md_ctx;
  uchar sum [64];
  byte local_4c8 [142];
  char acStack_43a [2];
  char line [1024];
  
  mbedtls_md_init(&md_ctx);
  if (argc == 1) {
    puts("print mode:  generic_sum <mbedtls_md> <file> <file> ...");
    puts("check mode:  generic_sum <mbedtls_md> -c <checksum file>");
    puts("\nAvailable message digests:");
    for (pmVar5 = (mbedtls_md_type_t *)mbedtls_md_list(); *pmVar5 != MBEDTLS_MD_NONE;
        pmVar5 = pmVar5 + 1) {
      pmVar6 = mbedtls_md_info_from_type(*pmVar5);
      pcVar7 = mbedtls_md_get_name(pmVar6);
      printf("  %s\n",pcVar7);
    }
    return 1;
  }
  pmVar6 = mbedtls_md_info_from_string(argv[1]);
  if (pmVar6 == (mbedtls_md_info_t *)0x0) {
    fprintf(_stderr,"Message Digest \'%s\' not found\n",argv[1]);
    return 1;
  }
  iVar3 = mbedtls_md_setup(&md_ctx,pmVar6,0);
  if (iVar3 != 0) {
    fwrite("Failed to initialize context.\n",0x1e,1,_stderr);
    return 1;
  }
  if (argc == 4) {
    pbVar10 = (byte *)argv[2];
    uVar4 = *pbVar10 - 0x2d;
    if ((uVar4 == 0) && (uVar4 = pbVar10[1] - 99, uVar4 == 0)) {
      uVar4 = (uint)pbVar10[2];
    }
    if (uVar4 == 0) {
      pcVar7 = argv[3];
      __stream = fopen(pcVar7,"rb");
      if (__stream == (FILE *)0x0) {
        printf("failed to open: %s\n",pcVar7);
        uVar4 = 1;
      }
      else {
        sVar14 = 0x400;
        memset(line,0,0x400);
        uVar12 = 0;
        uVar4 = 0;
        local_534 = 0;
        local_538 = 0;
        while (pcVar7 = fgets(line,(int)sVar14 + -1,__stream), pcVar7 != (char *)0x0) {
          sVar14 = strlen(line);
          bVar1 = mbedtls_md_get_size(pmVar6);
          if (((sVar14 < (ulong)bVar1 * 2 + 4) ||
              (bVar1 = mbedtls_md_get_size(pmVar6), line[(ulong)bVar1 * 2] != ' ')) ||
             (bVar1 = mbedtls_md_get_size(pmVar6), line[(ulong)bVar1 * 2 + 1] != ' ')) {
            pcVar7 = mbedtls_md_get_name(pmVar6);
            printf("No \'%s\' hash found on line.\n",pcVar7);
          }
          else {
            cVar9 = acStack_43a[sVar14 + 1];
            sVar8 = sVar14 - 1;
            if (cVar9 == '\n') {
              acStack_43a[sVar14 + 1] = '\0';
              cVar9 = acStack_43a[sVar14];
              sVar8 = sVar14 - 2;
              sVar14 = sVar14 - 1;
            }
            if (cVar9 == '\r') {
              line[sVar8] = '\0';
              sVar14 = sVar8;
            }
            local_534 = local_534 + 1;
            bVar1 = mbedtls_md_get_size(pmVar6);
            iVar3 = generic_wrapper(pmVar6,line + (ulong)bVar1 * 2 + 2,sum);
            if (iVar3 == 0) {
              pbVar10 = local_4c8;
              for (uVar13 = 0; bVar1 = mbedtls_md_get_size(pmVar6), uVar13 < bVar1;
                  uVar13 = uVar13 + 1) {
                sprintf((char *)pbVar10,"%02x",(ulong)sum[uVar13]);
                pbVar10 = pbVar10 + 2;
              }
              bVar1 = 0;
              for (uVar13 = 0; bVar2 = mbedtls_md_get_size(pmVar6), uVar13 < (uint)bVar2 * 2;
                  uVar13 = uVar13 + 1) {
                bVar1 = bVar1 | local_4c8[uVar13] ^ line[uVar13];
              }
              local_538 = local_538 + 1;
              sVar14 = 0x400;
              if (bVar1 != 0) {
                uVar4 = uVar4 + 1;
                fprintf(_stderr,"wrong checksum: %s\n",line + 0x42);
                sVar14 = 0x400;
              }
            }
            else {
              uVar12 = uVar12 + 1;
            }
          }
        }
        if (uVar12 != 0) {
          printf("WARNING: %d (out of %d) input files could not be read\n",(ulong)uVar12,
                 (ulong)local_534);
        }
        if (uVar4 != 0) {
          printf("WARNING: %d (out of %d) computed checksums did not match\n",(ulong)uVar4,
                 (ulong)local_538);
        }
        fclose(__stream);
        uVar4 = (uint)(uVar4 != 0 || uVar12 != 0);
      }
      goto LAB_0010360e;
    }
  }
  uVar4 = 0;
  for (lVar11 = 2; lVar11 < argc; lVar11 = lVar11 + 1) {
    pcVar7 = argv[lVar11];
    iVar3 = generic_wrapper(pmVar6,pcVar7,(uchar *)line);
    uVar12 = 1;
    if (iVar3 == 0) {
      for (uVar13 = 0; bVar1 = mbedtls_md_get_size(pmVar6), uVar13 < bVar1; uVar13 = uVar13 + 1) {
        printf("%02x",(ulong)(byte)line[uVar13]);
      }
      uVar12 = 0;
      printf("  %s\n",pcVar7);
    }
    uVar4 = uVar4 | uVar12;
  }
LAB_0010360e:
  mbedtls_md_free(&md_ctx);
  return uVar4;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret, i;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    mbedtls_md_init( &md_ctx );

    if( argc == 1 )
    {
        const int *list;

        mbedtls_printf( "print mode:  generic_sum <mbedtls_md> <file> <file> ...\n" );
        mbedtls_printf( "check mode:  generic_sum <mbedtls_md> -c <checksum file>\n" );

        mbedtls_printf( "\nAvailable message digests:\n" );
        list = mbedtls_md_list();
        while( *list )
        {
            md_info = mbedtls_md_info_from_type( *list );
            mbedtls_printf( "  %s\n", mbedtls_md_get_name( md_info ) );
            list++;
        }

#if defined(_WIN32)
        mbedtls_printf( "\n  Press Enter to exit this program.\n" );
        fflush( stdout ); getchar();
#endif

        return( 1 );
    }

    /*
     * Read the MD from the command line
     */
    md_info = mbedtls_md_info_from_string( argv[1] );
    if( md_info == NULL )
    {
        mbedtls_fprintf( stderr, "Message Digest '%s' not found\n", argv[1] );
        return( 1 );
    }
    if( mbedtls_md_setup( &md_ctx, md_info, 0 ) )
    {
        mbedtls_fprintf( stderr, "Failed to initialize context.\n" );
        return( 1 );
    }

    ret = 0;
    if( argc == 4 && strcmp( "-c", argv[2] ) == 0 )
    {
        ret |= generic_check( md_info, argv[3] );
        goto exit;
    }

    for( i = 2; i < argc; i++ )
        ret |= generic_print( md_info, argv[i] );

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}